

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.c
# Opt level: O0

int lyd_wd_toprint(lyd_node *node,int options)

{
  lys_node *plVar1;
  long lVar2;
  bool bVar3;
  int iVar4;
  lyd_node_leaf_list *plStack_38;
  int flag;
  lyd_node *elem;
  lyd_node *next;
  lyd_node *subroot;
  int options_local;
  lyd_node *node_local;
  
  bVar3 = false;
  if ((options & 0x10U) == 0) {
    plStack_38 = (lyd_node_leaf_list *)node;
    if ((((node->field_0x9 & 1) == 0) || ((options & 0xf0U) != 0)) ||
       ((node->schema->flags & 2) != 0)) {
      if ((((node->field_0x9 & 1) != 0) && (node->schema->nodetype == LYS_CONTAINER)) &&
         ((options & 4U) == 0)) {
        while (plStack_38 != (lyd_node_leaf_list *)0x0) {
          if (((lyd_node *)plStack_38)->schema->nodetype != LYS_CONTAINER) {
            bVar3 = true;
            break;
          }
          elem = ((lyd_node *)plStack_38)->child;
          if ((((lyd_node *)plStack_38)->schema->nodetype & (LYS_ANYDATA|LYS_LEAFLIST|LYS_LEAF)) !=
              LYS_UNKNOWN) {
            elem = (lyd_node *)0x0;
          }
          if (elem == (lyd_node *)0x0) {
            if (plStack_38 == (lyd_node_leaf_list *)node) break;
            elem = ((lyd_node *)plStack_38)->next;
          }
          while ((elem == (lyd_node *)0x0 &&
                 (plStack_38 = (lyd_node_leaf_list *)((lyd_node *)plStack_38)->parent,
                 ((lyd_node *)plStack_38)->parent != node->parent))) {
            elem = ((lyd_node *)plStack_38)->next;
          }
          plStack_38 = (lyd_node_leaf_list *)elem;
        }
        if (!bVar3) {
          return 0;
        }
      }
    }
    else {
      while (plStack_38 != (lyd_node_leaf_list *)0x0) {
        if ((((lyd_node *)plStack_38)->schema->flags & 2) != 0) {
          bVar3 = true;
          break;
        }
        elem = ((lyd_node *)plStack_38)->child;
        if ((((lyd_node *)plStack_38)->schema->nodetype & (LYS_ANYDATA|LYS_LEAFLIST|LYS_LEAF)) !=
            LYS_UNKNOWN) {
          elem = (lyd_node *)0x0;
        }
        if (elem == (lyd_node *)0x0) {
          if (plStack_38 == (lyd_node_leaf_list *)node) break;
          elem = ((lyd_node *)plStack_38)->next;
        }
        while ((elem == (lyd_node *)0x0 &&
               (plStack_38 = (lyd_node_leaf_list *)((lyd_node *)plStack_38)->parent,
               ((lyd_node *)plStack_38)->parent != node->parent))) {
          elem = ((lyd_node *)plStack_38)->next;
        }
        plStack_38 = (lyd_node_leaf_list *)elem;
      }
      if (!bVar3) {
        return 0;
      }
    }
  }
  else {
    if ((node->field_0x9 & 1) != 0) {
      return 0;
    }
    if ((node->schema->nodetype & (LYS_LEAFLIST|LYS_LEAF)) == LYS_UNKNOWN) {
      if (((node->schema->nodetype & LYS_CONTAINER) != LYS_UNKNOWN) &&
         (plVar1 = node->schema, lVar2._0_2_ = plVar1[1].flags, lVar2._2_1_ = plVar1[1].ext_size,
         lVar2._3_1_ = plVar1[1].iffeature_size, lVar2._4_1_ = plVar1[1].padding[0],
         lVar2._5_1_ = plVar1[1].padding[1], lVar2._6_1_ = plVar1[1].padding[2],
         lVar2._7_1_ = plVar1[1].padding[3], lVar2 == 0)) {
        for (next = node->child; next != (lyd_node *)0x0 && !bVar3; next = next->next) {
          plStack_38 = (lyd_node_leaf_list *)next;
          while (plStack_38 != (lyd_node_leaf_list *)0x0) {
            if ((plStack_38->field_0x9 & 1) == 0) {
              if (((plStack_38->schema->nodetype & (LYS_LEAFLIST|LYS_LEAF)) != LYS_UNKNOWN) &&
                 (iVar4 = lyd_wd_default(plStack_38), iVar4 == 0)) {
                bVar3 = true;
                break;
              }
              if ((plStack_38->schema->nodetype & (LYS_ANYDATA|LYS_LEAFLIST|LYS_LEAF)) ==
                  LYS_UNKNOWN) {
                elem = (lyd_node *)plStack_38->value_str;
              }
              else {
                elem = (lyd_node *)0x0;
              }
              if (elem == (lyd_node *)0x0) goto LAB_00195693;
            }
            else {
LAB_00195693:
              if (plStack_38 == (lyd_node_leaf_list *)next) break;
              elem = plStack_38->next;
            }
            while ((elem == (lyd_node *)0x0 &&
                   (plStack_38 = (lyd_node_leaf_list *)plStack_38->parent,
                   plStack_38->parent != next->parent))) {
              elem = plStack_38->next;
            }
            plStack_38 = (lyd_node_leaf_list *)elem;
          }
        }
        if (!bVar3) {
          return 0;
        }
      }
    }
    else {
      iVar4 = lyd_wd_default((lyd_node_leaf_list *)node);
      if (iVar4 != 0) {
        return 0;
      }
    }
  }
  return 1;
}

Assistant:

int
lyd_wd_toprint(const struct lyd_node *node, int options)
{
    const struct lyd_node *subroot, *next, *elem;
    int flag = 0;

    if (options & LYP_WD_TRIM) {
        /* do not print default nodes */
        if (node->dflt) {
            /* implicit default node */
            return 0;
        } else if (node->schema->nodetype & (LYS_LEAF | LYS_LEAFLIST)) {
            if (lyd_wd_default((struct lyd_node_leaf_list *)node)) {
                /* explicit default node */
                return 0;
            }
        } else if ((node->schema->nodetype & (LYS_CONTAINER)) && !((struct lys_node_container *)node->schema)->presence) {
            /* get know if non-presence container contains non-default node */
            for (subroot = node->child; subroot && !flag; subroot = subroot->next) {
                LY_TREE_DFS_BEGIN(subroot, next, elem) {
                    if (elem->dflt) {
                        /* skip subtree */
                        goto trim_dfs_nextsibling;
                    } else if (elem->schema->nodetype & (LYS_LEAF | LYS_LEAFLIST)) {
                        if (!lyd_wd_default((struct lyd_node_leaf_list *)elem)) {
                            /* non-default node */
                            flag = 1;
                            break;
                        }
                    }

                    /* modified LY_TREE_DFS_END */
                    /* select element for the next run - children first */
                    /* child exception for leafs, leaflists and anyxml without children */
                    if (elem->schema->nodetype & (LYS_LEAF | LYS_LEAFLIST | LYS_ANYDATA)) {
                        next = NULL;
                    } else {
                        next = elem->child;
                    }
                    if (!next) {
trim_dfs_nextsibling:
                        /* no children */
                        if (elem == subroot) {
                            /* we are done, (START) has no children */
                            break;
                        }
                        /* try siblings */
                        next = elem->next;
                    }
                    while (!next) {
                        /* parent is already processed, go to its sibling */
                        elem = elem->parent;
                        /* no siblings, go back through parents */
                        if (elem->parent == subroot->parent) {
                            /* we are done, no next element to process */
                            break;
                        }
                        next = elem->next;
                    }
                }
            }
            if (!flag) {
                /* only default nodes in subtree, do not print the container */
                return 0;
            }
        }
    } else if (node->dflt && !(options & LYP_WD_MASK) && !(node->schema->flags & LYS_CONFIG_R)) {
        /* LYP_WD_EXPLICIT
         * - print only if it contains status data in its subtree */
        LY_TREE_DFS_BEGIN(node, next, elem) {
            if (elem->schema->flags & LYS_CONFIG_R) {
                flag = 1;
                break;
            }
            LY_TREE_DFS_END(node, next, elem)
        }
        if (!flag) {
            return 0;
        }
    } else if (node->dflt && node->schema->nodetype == LYS_CONTAINER && !(options & LYP_KEEPEMPTYCONT)) {
        /* avoid empty default containers */
        LY_TREE_DFS_BEGIN(node, next, elem) {
            if (elem->schema->nodetype != LYS_CONTAINER) {
                flag = 1;
                break;
            }
            LY_TREE_DFS_END(node, next, elem)
        }
        if (!flag) {
            return 0;
        }
    }

    return 1;
}